

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkaccessmanager.cpp
# Opt level: O3

void __thiscall QNetworkAccessManager::~QNetworkAccessManager(QNetworkAccessManager *this)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long in_FS_OFFSET;
  QList<QNetworkReply_*> list;
  QArrayData *local_48;
  long lStack_40;
  long local_38;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  *(undefined ***)this = &PTR_metaObject_002cabd0;
  if (*(long **)(*(long *)(this + 8) + 0x98) != (long *)0x0) {
    (**(code **)(**(long **)(*(long *)(this + 8) + 0x98) + 8))();
  }
  local_48 = (QArrayData *)0x0;
  lStack_40 = 0;
  local_38 = 0;
  qt_qFindChildren_helper(this,0,0,&QNetworkReply::staticMetaObject,&local_48,1);
  lVar1 = lStack_40;
  if (local_38 != 0) {
    lVar3 = local_38 << 3;
    lVar2 = 0;
    do {
      if (*(long **)(lVar1 + lVar2) != (long *)0x0) {
        (**(code **)(**(long **)(lVar1 + lVar2) + 0x20))();
      }
      lVar2 = lVar2 + 8;
    } while (lVar3 != lVar2);
  }
  if (local_48 != (QArrayData *)0x0) {
    LOCK();
    (local_48->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_48->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_48->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_48,8,0x10);
    }
  }
  QObject::~QObject((QObject *)this);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QNetworkAccessManager::~QNetworkAccessManager()
{
#ifndef QT_NO_NETWORKPROXY
    delete d_func()->proxyFactory;
#endif

    // Delete the QNetworkReply children first.
    // Else a QAbstractNetworkCache might get deleted in ~QObject
    // before a QNetworkReply that accesses the QAbstractNetworkCache
    // object in its destructor.
    qDeleteAll(findChildren<QNetworkReply *>());
    // The other children will be deleted in this ~QObject
    // FIXME instead of this "hack" make the QNetworkReplyImpl
    // properly watch the cache deletion, e.g. via a QWeakPointer.
}